

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_integer64v(NegativeTestContext *ctx)

{
  allocator<char> local_39;
  string local_38;
  GLint64 local_18;
  GLint64 params;
  NegativeTestContext *ctx_local;
  
  local_18 = -1;
  params = (GLint64)ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if pname is not one of the allowed values.",&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glGetInteger64v((CallLogWrapper *)params,0xffffffff,&local_18);
  NegativeTestContext::expectError((NegativeTestContext *)params,0x500);
  NegativeTestContext::endSection((NegativeTestContext *)params);
  return;
}

Assistant:

void get_integer64v (NegativeTestContext& ctx)
{
	GLint64 params = -1;
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not one of the allowed values.");
	ctx.glGetInteger64v(-1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}